

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O0

bool __thiscall UEFIToolApplication::event(UEFIToolApplication *this,QEvent *event)

{
  UEFITool *this_00;
  byte bVar1;
  Type TVar2;
  QString local_38;
  QFileOpenEvent *local_20;
  QFileOpenEvent *openEvent;
  QEvent *event_local;
  UEFIToolApplication *this_local;
  
  openEvent = (QFileOpenEvent *)event;
  event_local = (QEvent *)this;
  TVar2 = QEvent::type(event);
  if (TVar2 == FileOpen) {
    local_20 = openEvent;
    this_00 = this->tool;
    QFileOpenEvent::file(&local_38,openEvent);
    UEFITool::openImageFile(this_00,&local_38);
    QString::~QString(&local_38);
  }
  bVar1 = QApplication::event((QEvent *)this);
  return (bool)(bVar1 & 1);
}

Assistant:

virtual bool event(QEvent *event)
    {
        if (event->type() == QEvent::FileOpen) {
            QFileOpenEvent *openEvent = static_cast<QFileOpenEvent *>(event);
            tool->openImageFile(openEvent->file());
        }
        
        return QApplication::event(event);
    }